

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_checksum.cpp
# Opt level: O2

uint lzham::adler32(void *pBuf,size_t buflen,uint adler32)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (pBuf == (void *)0x0) {
    uVar9 = 1;
  }
  else {
    uVar11 = (ulong)adler32 & 0xffff;
    uVar4 = (ulong)(adler32 >> 0x10);
    uVar8 = buflen % 0x15b0;
    while (buflen != 0) {
      for (uVar12 = 0; uVar12 + 7 < uVar8; uVar12 = uVar12 + 8) {
        lVar10 = uVar11 + *(byte *)((long)pBuf + uVar12);
        lVar1 = (ulong)*(byte *)((long)pBuf + uVar12 + 1) + lVar10;
        lVar5 = (ulong)*(byte *)((long)pBuf + uVar12 + 2) + lVar1;
        lVar2 = (ulong)*(byte *)((long)pBuf + uVar12 + 3) + lVar5;
        lVar6 = (ulong)*(byte *)((long)pBuf + uVar12 + 4) + lVar2;
        lVar3 = (ulong)*(byte *)((long)pBuf + uVar12 + 5) + lVar6;
        lVar7 = (ulong)*(byte *)((long)pBuf + uVar12 + 6) + lVar3;
        uVar11 = (ulong)*(byte *)((long)pBuf + uVar12 + 7) + lVar7;
        uVar4 = uVar4 + lVar10 + lVar1 + lVar5 + lVar2 + lVar6 + lVar3 + lVar7 + uVar11;
      }
      for (; uVar12 < uVar8; uVar12 = uVar12 + 1) {
        uVar11 = uVar11 + *(byte *)((long)pBuf + uVar12);
        uVar4 = uVar4 + uVar11;
      }
      uVar11 = uVar11 % 0xfff1;
      uVar4 = uVar4 % 0xfff1;
      pBuf = (void *)((long)pBuf + uVar12);
      buflen = buflen - uVar8;
      uVar8 = 0x15b0;
    }
    uVar9 = (int)uVar11 + (int)uVar4 * 0x10000;
  }
  return uVar9;
}

Assistant:

uint adler32(const void* pBuf, size_t buflen, uint adler32)
   {
      if (!pBuf)
         return cInitAdler32;

      const uint8* buffer = static_cast<const uint8*>(pBuf);
      
      const unsigned long ADLER_MOD = 65521;
      unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
      size_t blocklen;
      unsigned long i;

      blocklen = buflen % 5552;
      while (buflen) 
      {
         for (i=0; i + 7 < blocklen; i += 8) 
         {
            s1 += buffer[0], s2 += s1;
            s1 += buffer[1], s2 += s1;
            s1 += buffer[2], s2 += s1;
            s1 += buffer[3], s2 += s1;
            s1 += buffer[4], s2 += s1;
            s1 += buffer[5], s2 += s1;
            s1 += buffer[6], s2 += s1;
            s1 += buffer[7], s2 += s1;

            buffer += 8;
         }

         for (; i < blocklen; ++i)
            s1 += *buffer++, s2 += s1;

         s1 %= ADLER_MOD, s2 %= ADLER_MOD;
         buflen -= blocklen;
         blocklen = 5552;
      }
      return static_cast<uint>((s2 << 16) + s1);
   }